

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlUTF8Strsub(xmlChar *utf,int start,int len)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int local_24;
  int ch;
  int i;
  int len_local;
  int start_local;
  xmlChar *utf_local;
  
  if (utf == (xmlChar *)0x0) {
    utf_local = (xmlChar *)0x0;
  }
  else if (start < 0) {
    utf_local = (xmlChar *)0x0;
  }
  else if (len < 0) {
    utf_local = (xmlChar *)0x0;
  }
  else {
    _len_local = utf;
    for (local_24 = 0; local_24 < start; local_24 = local_24 + 1) {
      pbVar3 = _len_local + 1;
      bVar1 = *_len_local;
      if (bVar1 == 0) {
        return (xmlChar *)0x0;
      }
      _len_local = pbVar3;
      if ((bVar1 & 0x80) != 0) {
        while (bVar1 = bVar1 << 1, (bVar1 & 0x80) != 0) {
          bVar2 = *_len_local;
          _len_local = _len_local + 1;
          if (bVar2 == 0) {
            return (xmlChar *)0x0;
          }
        }
      }
    }
    utf_local = xmlUTF8Strndup(_len_local,len);
  }
  return utf_local;
}

Assistant:

xmlChar *
xmlUTF8Strsub(const xmlChar *utf, int start, int len) {
    int i;
    int ch;

    if (utf == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    /*
     * Skip over any leading chars
     */
    for (i = 0; i < start; i++) {
        ch = *utf++;
        if (ch == 0)
            return(NULL);
        /* skip over remaining bytes for this char */
        if (ch & 0x80) {
            ch <<= 1;
            while (ch & 0x80) {
                if (*utf++ == 0)
                    return(NULL);
                ch <<= 1;
            }
        }
    }

    return(xmlUTF8Strndup(utf, len));
}